

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O1

void __thiscall cookmem::PtrAVLTree::add(PtrAVLTree *this,void *ptr,size_t size)

{
  Node *pNVar1;
  Node *pNVar2;
  short depth;
  long lVar3;
  Node *stack [65];
  long alStack_40220 [32768];
  long lStack_220;
  Node *local_218;
  long local_210 [65];
  
  *(size_t *)((long)ptr + 8) = size;
  pNVar2 = this->m_root;
  if (pNVar2 == (Node *)0x0) {
    *(undefined8 *)((long)ptr + 0x10) = 0;
    *(undefined8 *)((long)ptr + 0x18) = 0;
    *(undefined8 *)((long)ptr + 0x20) = 0;
    *(undefined2 *)((long)ptr + 0x28) = 1;
    this->m_root = (Node *)ptr;
  }
  else {
    local_218 = pNVar2;
    depth = 0;
    do {
      lVar3 = 0x10;
      if ((pNVar2->size <= size) && (lVar3 = 0x18, size <= pNVar2->size)) {
        pNVar1 = pNVar2->next;
        pNVar2->next = (Node *)ptr;
        *(Node **)((long)ptr + 0x20) = pNVar1;
        *(Node **)((long)ptr + 0x10) = pNVar2;
        *(undefined2 *)((long)ptr + 0x28) = 0xffff;
        if (pNVar1 == (Node *)0x0) {
          return;
        }
        pNVar1->left = (Node *)ptr;
        return;
      }
      pNVar2 = *(Node **)((long)&pNVar2->reserved + lVar3);
      local_210[depth] = (long)pNVar2;
      depth = depth + 1;
    } while (pNVar2 != (Node *)0x0);
    *(void **)((&lStack_220)[depth] + 0x10 +
              (ulong)(*(ulong *)((&lStack_220)[depth] + 8) <= size) * 8) = ptr;
    *(undefined8 *)((long)ptr + 0x10) = 0;
    *(undefined8 *)((long)ptr + 0x18) = 0;
    *(undefined8 *)((long)ptr + 0x20) = 0;
    *(undefined2 *)((long)ptr + 0x28) = 1;
    lStack_220 = 0x10723b;
    pNVar2 = balance(&local_218,depth);
    if (pNVar2 != (Node *)0x0) {
      this->m_root = pNVar2;
    }
  }
  return;
}

Assistant:

void
    add (void* ptr, std::size_t size)
    {
        Node*   node = reinterpret_cast<Node*>(ptr);
        node->size = size;

        if (m_root == nullptr)
        {
            node->left = nullptr;
            node->right = nullptr;
            node->next = nullptr;
            node->height = 1;
            m_root = node;

            return;
        }

        Node* root;
        Node* stack[sizeof(Node*) * 8 + 1];
        std::int16_t depth;

        root = stack[0] = m_root;

        for (depth = 0; ; ++depth)
        {
            if (root == nullptr)
            {
                setParent (node, stack[depth - 1]);
                node->left = nullptr;
                node->right = nullptr;
                node->next = nullptr;
                node->height = 1;

                root = balance (stack, depth);
                if (root != nullptr)
                {
                    m_root = root;
                }
                return;
            }

            if (size < root->size)
            {
                root = stack[depth + 1] = root->left;
                continue;
            }
            else if (size > root->size)
            {
                root = stack[depth + 1] = root->right;
                continue;
            }
            else
            {
                // The current root matches the node's size.  In this case we
                // just add node to the next pointer of the root.
                //
                Node* next = root->next;
                root->next = node;
                node->next = next;
                node->left = root;
                node->height = -1;      // indicating that this node is in a DLL
                if (next)
                {
                    next->left = node;
                }

                // We can simply return since the tree structure is not
                // changed.
                return;
            }
        }
        throw Exception (MEM_ERROR_GENERAL, "Invalid PtrAVLTree.");
    }